

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<short,_short>::Update<duckdb::EmptyBitpackingWriter>
          (BitpackingState<short,_short> *this,short value,bool is_valid)

{
  short sVar1;
  idx_t iVar2;
  bool bVar3;
  
  iVar2 = this->compression_buffer_idx;
  this->compression_buffer_validity[iVar2] = is_valid;
  this->all_valid = (bool)(this->all_valid & is_valid);
  this->all_invalid = (bool)(this->all_invalid & !is_valid);
  if (is_valid) {
    this->compression_buffer[iVar2] = value;
    sVar1 = this->minimum;
    if (value <= sVar1) {
      sVar1 = value;
    }
    this->minimum = sVar1;
    sVar1 = this->maximum;
    if (this->maximum <= value) {
      sVar1 = value;
    }
    this->maximum = sVar1;
  }
  this->compression_buffer_idx = iVar2 + 1;
  if (iVar2 + 1 == 0x800) {
    bVar3 = Flush<duckdb::EmptyBitpackingWriter>(this);
    this->minimum = 0x7fff;
    this->minimum_delta = 0x7fff;
    this->maximum = -0x8000;
    this->min_max_diff = 0;
    this->maximum_delta = -0x8000;
    this->min_max_delta_diff = 0;
    this->delta_offset = 0;
    this->all_valid = true;
    this->all_invalid = true;
    this->can_do_delta = false;
    this->can_do_for = false;
    this->compression_buffer_idx = 0;
  }
  else {
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}